

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

int __thiscall rapidxml::memory_pool<char>::init(memory_pool<char> *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  
  this->m_begin = this->m_static_memory;
  pcVar1 = align(this,this->m_begin);
  this->m_ptr = pcVar1;
  this->m_end = (char *)&this->m_alloc_func;
  this->m_nullstr = (char *)0x0;
  this->m_xmlns_xml = (char *)0x0;
  this->m_xmlns_xmlns = (char *)0x0;
  return (int)this;
}

Assistant:

void init()
        {
            m_begin = m_static_memory;
            m_ptr = align(m_begin);
            m_end = m_static_memory + sizeof(m_static_memory);
            m_nullstr = 0;
            m_xmlns_xml = 0;
            m_xmlns_xmlns = 0;
        }